

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::resize(SVInt *this,bitwidth_t bits)

{
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  double in_XMM0_Qa;
  SVInt SVar2;
  SVInt *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 uVar1;
  
  if (in_EDX < *(uint *)(in_RSI + 8)) {
    trunc((SVInt *)in_RDI.pVal,in_XMM0_Qa);
    uVar1 = extraout_RDX;
  }
  else if (*(uint *)(in_RSI + 8) < in_EDX) {
    SVar2 = extend((SVInt *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   (bitwidth_t)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    uVar1 = SVar2.super_SVIntStorage._8_8_;
  }
  else {
    SVInt((SVInt *)in_RDI.pVal,in_stack_ffffffffffffffc8);
    uVar1 = extraout_RDX_00;
  }
  SVar2.super_SVIntStorage.bitWidth = (int)uVar1;
  SVar2.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar1 >> 0x20);
  SVar2.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar1 >> 0x28);
  SVar2.super_SVIntStorage._14_2_ = (short)((ulong)uVar1 >> 0x30);
  SVar2.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar2.super_SVIntStorage;
}

Assistant:

SVInt SVInt::resize(bitwidth_t bits) const {
    if (bits < bitWidth)
        return trunc(bits);
    if (bits > bitWidth)
        return extend(bits, signFlag);
    return *this;
}